

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::init
          (UserDefinedIOCase *this,EVP_PKEY_CTX *ctx)

{
  Precision *pPVar1;
  deInt32 *pdVar2;
  undefined1 *puVar3;
  pointer pcVar4;
  VertexIOArraySize VVar5;
  IOType IVar6;
  TessControlOutArraySize TVar7;
  ContextInfo *pCVar8;
  Context *pCVar9;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar10;
  int iVar11;
  int iVar12;
  RenderTarget *renderTarget;
  long *plVar13;
  IOBlock *pIVar14;
  StructType *pSVar15;
  anon_struct_8_2_bfd9d0cb_for_basic aVar16;
  pointer pMVar17;
  pointer pMVar18;
  long *plVar19;
  pointer pSVar20;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  TestError *this_01;
  undefined8 uVar23;
  undefined1 usePointMode;
  size_type *psVar24;
  _Rb_tree_node_base *p_Var25;
  _Base_ptr p_Var26;
  undefined **ppuVar27;
  long *plVar28;
  TopLevelObject *pTVar29;
  size_type *psVar30;
  TopLevelObject *pTVar31;
  Context *pCVar32;
  int precision;
  int precision_00;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType extraout_EDX_03;
  TessPrimitiveType primType;
  char *pcVar33;
  anon_struct_8_2_bfd9d0cb_for_basic extraout_RDX;
  byte bVar34;
  int *piVar35;
  long lVar36;
  char *pcVar37;
  undefined1 *puVar38;
  undefined1 auVar39 [8];
  long lVar40;
  UserDefinedIOCase *pUVar41;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
  blockMembers;
  Variable var1;
  string tessellationEvaluationTemplate;
  Variable var0;
  string fragmentShaderTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string tcsStatements;
  string tesStatements;
  string inMaybePatch;
  string outMaybePatch;
  string tcsDeclarations;
  string vertexAttrArrayInputSize;
  string tesDeclarations;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [32];
  undefined1 local_488 [8];
  undefined1 auStack_480 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_470;
  UserDefinedIOCase *local_458;
  undefined1 local_450 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_438;
  VarType local_428;
  bool local_410;
  IOType local_404;
  StructType *local_400;
  size_type *local_3f8;
  value_type local_3f0;
  undefined1 local_3d0 [24];
  long lStack_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  Data local_380;
  bool local_370;
  ios_base local_340 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_320;
  deUint32 local_308;
  undefined1 local_300 [204];
  VertexIOArraySize local_234;
  undefined1 local_230 [32];
  Context *local_210;
  undefined1 local_208 [16];
  long lStack_1f8;
  ContextInfo *local_1f0 [2];
  undefined1 local_1e0 [33];
  undefined7 uStack_1bf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  bool local_1a0;
  undefined7 uStack_19f;
  _Base_ptr local_190;
  size_t local_188;
  _Base_ptr local_180;
  _Base_ptr p_Stack_178;
  _Rb_tree_node_base *local_170;
  _Base_ptr local_168;
  _Rb_tree_node_base local_160;
  undefined1 local_140 [16];
  string local_130;
  _Base_ptr local_110;
  undefined8 local_108;
  undefined1 local_100 [16];
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0 [16];
  value_type local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  local_404 = this->m_ioType;
  VVar5 = this->m_vertexIOArraySize;
  if (VVar5 == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY) {
    pCVar8 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar12 = (*pCVar8->_vptr_ContextInfo[2])(pCVar8,0x8e7d);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::ostream::operator<<((ostringstream *)local_3b0,iVar12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    if (VVar5 == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
      pcVar37 = "gl_MaxPatchVertices";
      pcVar33 = "";
    }
    else {
      if (VVar5 != VERTEX_IO_ARRAY_SIZE_IMPLICIT) {
        uVar23 = std::__throw_logic_error("basic_string::_M_construct null not valid");
        IOBlock::Member::~Member((Member *)local_3b0);
        if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
          operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
        }
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
        ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                   *)local_4b8);
        glu::VarType::~VarType((VarType *)local_3d0);
        glu::VarType::~VarType((VarType *)&local_210);
        if ((bool *)local_1b0._M_allocated_capacity != &local_1a0) {
          operator_delete((void *)local_1b0._M_allocated_capacity,CONCAT71(uStack_19f,local_1a0) + 1
                         );
        }
        if (local_110 != (_Base_ptr)local_100) {
          operator_delete(local_110,CONCAT71(local_100._1_7_,local_100[0]) + 1);
        }
        if ((pointer)local_1e0._16_8_ != (pointer)(local_1e0 + 0x20)) {
          operator_delete((void *)local_1e0._16_8_,CONCAT71(uStack_1bf,local_1e0[0x20]) + 1);
        }
        if (local_160._M_left != (_Base_ptr)local_140) {
          operator_delete(local_160._M_left,CONCAT71(local_140._1_7_,local_140[0]) + 1);
        }
        if (local_190 != (_Base_ptr)&local_180) {
          operator_delete(local_190,(ulong)((long)&local_180->_M_color + 1));
        }
        if (local_170 != &local_160) {
          operator_delete(local_170,local_160._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar23);
      }
      pcVar33 = "";
      pcVar37 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_140 + 0x10),pcVar37,pcVar33);
  }
  ppuVar27 = (undefined **)(local_450 + 0x10);
  local_450._8_8_ = (pointer)0x0;
  local_450._16_8_ = local_450._16_8_ & 0xffffffffffffff00;
  local_450._0_8_ = ppuVar27;
  plVar13 = (long *)std::__cxx11::string::append(local_450);
  local_3b0._0_8_ = local_3a0;
  psVar24 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar24) {
    local_3a0._0_8_ = *psVar24;
    local_3a0._8_8_ = plVar13[3];
  }
  else {
    local_3a0._0_8_ = *psVar24;
    local_3b0._0_8_ = (size_type *)*plVar13;
  }
  local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)psVar24;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_3b0);
  local_170 = &local_160;
  p_Var25 = (_Rb_tree_node_base *)(plVar13 + 2);
  if ((_Rb_tree_node_base *)*plVar13 == p_Var25) {
    local_160._0_8_ = *(undefined8 *)p_Var25;
    local_160._M_parent = (_Base_ptr)plVar13[3];
  }
  else {
    local_160._0_8_ = *(undefined8 *)p_Var25;
    local_170 = (_Rb_tree_node_base *)*plVar13;
  }
  local_168 = (_Base_ptr)plVar13[1];
  *plVar13 = (long)p_Var25;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
    operator_delete((void *)local_3b0._0_8_,local_3a0._0_8_ + 1);
  }
  if ((undefined **)local_450._0_8_ != ppuVar27) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  local_450._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_450._16_8_ = local_450._16_8_ & 0xffffffffffffff00;
  local_450._0_8_ = ppuVar27;
  plVar13 = (long *)std::__cxx11::string::append(local_450);
  local_3b0._0_8_ = local_3a0;
  plVar19 = plVar13 + 2;
  if ((long *)*plVar13 == plVar19) {
    local_3a0._0_8_ = *plVar19;
    local_3a0._8_8_ = plVar13[3];
  }
  else {
    local_3a0._0_8_ = *plVar19;
    local_3b0._0_8_ = (long *)*plVar13;
  }
  local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)plVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_3b0);
  local_190 = (_Base_ptr)&local_180;
  p_Var26 = (_Base_ptr)(plVar13 + 2);
  if ((_Base_ptr)*plVar13 == p_Var26) {
    local_180 = *(_Base_ptr *)p_Var26;
    p_Stack_178 = (_Base_ptr)plVar13[3];
  }
  else {
    local_180 = *(_Base_ptr *)p_Var26;
    local_190 = (_Base_ptr)*plVar13;
  }
  local_188 = plVar13[1];
  *plVar13 = (long)p_Var26;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
    operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
  }
  local_234 = VVar5;
  if ((undefined **)local_450._0_8_ != ppuVar27) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  IVar6 = this->m_ioType;
  local_160._M_left = (_Base_ptr)local_140;
  local_160._M_right = (_Base_ptr)0x0;
  local_140[0] = _S_red;
  local_1e0._16_8_ = local_1e0 + 0x20;
  local_1e0._24_8_ = (pointer)0x0;
  local_1e0[0x20] = 0;
  local_110 = (_Base_ptr)local_100;
  local_108 = 0;
  local_100[0] = _S_red;
  local_1b0._M_allocated_capacity = (size_type)&local_1a0;
  local_1b0._8_8_ = 0;
  local_1a0 = false;
  local_3b0._0_8_ = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"S","");
  local_390._0_8_ = (pointer)0x0;
  local_390._8_8_ = (pointer)0x0;
  local_380._0_8_ = (pointer)0x0;
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::emplace_back<glu::StructType>
            (&this->m_structTypes,(StructType *)local_3b0);
  glu::StructType::~StructType((StructType *)local_3b0);
  glu::VarType::VarType((VarType *)&local_210,TYPE_FLOAT,PRECISION_HIGHP);
  local_400 = (this->m_structTypes).
              super__Vector_base<glu::StructType,_std::allocator<glu::StructType>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
  glu::VarType::VarType((VarType *)local_3d0,local_400);
  glu::VarType::VarType((VarType *)local_3b0,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember(local_400,"x",(VarType *)local_3b0);
  glu::VarType::~VarType((VarType *)local_3b0);
  glu::VarType::VarType((VarType *)local_3b0,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(local_400,"y",(VarType *)local_3b0);
  bVar34 = IVar6 < IO_TYPE_LAST & 0x2cU >> ((byte)IVar6 & 0x1f);
  glu::VarType::~VarType((VarType *)local_3b0);
  local_458 = this;
  if (bVar34 != 0) {
    glu::VarType::VarType((VarType *)local_3b0,(VarType *)&local_210,2);
    glu::StructType::addMember(local_400,"z",(VarType *)local_3b0);
    glu::VarType::~VarType((VarType *)local_3b0);
    if (bVar34 != 0) {
      local_4b8._0_8_ = (pointer)0x0;
      local_4b8._8_8_ = (pointer)0x0;
      local_4a8._0_8_ = (pointer)0x0;
      if (this->m_ioType != IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
        local_450._0_8_ = ppuVar27;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"blockS","");
        IOBlock::Member::Member((Member *)local_3b0,(string *)local_450,(VarType *)local_3d0);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
        ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                     *)local_4b8,(value_type *)local_3b0);
        glu::VarType::~VarType((VarType *)local_390);
        if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        if ((undefined **)local_450._0_8_ != ppuVar27) {
          operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
        }
      }
      local_450._0_8_ = ppuVar27;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"blockFa","");
      glu::VarType::VarType((VarType *)local_488,(VarType *)&local_210,3);
      IOBlock::Member::Member((Member *)local_3b0,(string *)local_450,(VarType *)local_488);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                   *)local_4b8,(value_type *)local_3b0);
      glu::VarType::~VarType((VarType *)local_390);
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      glu::VarType::~VarType((VarType *)local_488);
      if ((undefined **)local_450._0_8_ != ppuVar27) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      local_450._0_8_ = ppuVar27;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"blockSa","");
      glu::VarType::VarType((VarType *)local_488,(VarType *)local_3d0,2);
      IOBlock::Member::Member((Member *)local_3b0,(string *)local_450,(VarType *)local_488);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                   *)local_4b8,(value_type *)local_3b0);
      glu::VarType::~VarType((VarType *)local_390);
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      glu::VarType::~VarType((VarType *)local_488);
      if ((undefined **)local_450._0_8_ != ppuVar27) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      local_450._0_8_ = ppuVar27;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"blockF","");
      IOBlock::Member::Member((Member *)local_3b0,(string *)local_450,(VarType *)&local_210);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                   *)local_4b8,(value_type *)local_3b0);
      glu::VarType::~VarType((VarType *)local_390);
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      if ((undefined **)local_450._0_8_ != ppuVar27) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      pIVar14 = (IOBlock *)operator_new(0x60);
      local_3b0._0_8_ = local_3a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"TheBlock","");
      local_450._0_8_ = ppuVar27;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"tcBlock","");
      IOBlock::IOBlock(pIVar14,(string *)local_3b0,(string *)local_450,
                       (vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                        *)local_4b8);
      auStack_480._0_8_ = (VarType *)0x0;
      local_488 = (undefined1  [8])pIVar14;
      pSVar15 = (StructType *)operator_new(0x20);
      *(undefined4 *)&(pSVar15->m_typeName)._M_string_length = 0;
      *(undefined4 *)((long)&(pSVar15->m_typeName)._M_string_length + 4) = 0;
      (pSVar15->m_typeName)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_0219c2d0;
      *(IOBlock **)&(pSVar15->m_typeName).field_2 = pIVar14;
      *(undefined4 *)&(pSVar15->m_typeName)._M_string_length = 1;
      *(undefined4 *)((long)&(pSVar15->m_typeName)._M_string_length + 4) = 1;
      auStack_480._0_8_ = pSVar15;
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&this->m_tcsOutputs,(value_type *)local_488);
      psVar24 = &(pSVar15->m_typeName)._M_string_length;
      LOCK();
      *(int *)psVar24 = (int)*psVar24 + -1;
      UNLOCK();
      if ((int)*psVar24 == 0) {
        local_488 = (undefined1  [8])0x0;
        (**(code **)((((string *)auStack_480._0_8_)->_M_dataplus)._M_p + 0x10))();
      }
      LOCK();
      pPVar1 = &(((Data *)(auStack_480._0_8_ + 8))->basic).precision;
      *pPVar1 = *pPVar1 - PRECISION_MEDIUMP;
      UNLOCK();
      if (*pPVar1 == PRECISION_LOWP) {
        if ((StructType *)auStack_480._0_8_ != (StructType *)0x0) {
          (**(code **)((((string *)auStack_480._0_8_)->_M_dataplus)._M_p + 8))();
        }
        auStack_480._0_4_ = TYPE_INVALID;
        auStack_480._4_4_ = PRECISION_LOWP;
      }
      if ((undefined **)local_450._0_8_ != ppuVar27) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      pIVar14 = (IOBlock *)operator_new(0x60);
      local_3b0._0_8_ = local_3a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"TheBlock","");
      local_450._0_8_ = ppuVar27;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"teBlock","");
      IOBlock::IOBlock(pIVar14,(string *)local_3b0,(string *)local_450,
                       (vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                        *)local_4b8);
      auStack_480._0_8_ = (VarType *)0x0;
      local_488 = (undefined1  [8])pIVar14;
      aVar16 = (anon_struct_8_2_bfd9d0cb_for_basic)operator_new(0x20);
      *(undefined4 *)((long)aVar16 + 8) = 0;
      *(undefined4 *)((long)aVar16 + 0xc) = 0;
      *(undefined ***)aVar16 = &PTR__SharedPtrState_0219c2d0;
      *(IOBlock **)((long)aVar16 + 0x10) = pIVar14;
      *(undefined4 *)((long)aVar16 + 8) = 1;
      *(undefined4 *)((long)aVar16 + 0xc) = 1;
      auStack_480._0_8_ = aVar16;
      std::
      vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
      ::push_back(&this->m_tesInputs,(value_type *)local_488);
      piVar35 = (int *)((long)aVar16 + 8);
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 == 0) {
        local_488 = (undefined1  [8])0x0;
        (**(code **)((((string *)auStack_480._0_8_)->_M_dataplus)._M_p + 0x10))();
      }
      LOCK();
      pPVar1 = &(((Data *)(auStack_480._0_8_ + 8))->basic).precision;
      *pPVar1 = *pPVar1 - PRECISION_MEDIUMP;
      UNLOCK();
      if (*pPVar1 == PRECISION_LOWP) {
        if ((anon_struct_8_2_bfd9d0cb_for_basic)auStack_480._0_8_ !=
            (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
          (**(code **)((((string *)auStack_480._0_8_)->_M_dataplus)._M_p + 8))();
        }
        auStack_480._0_4_ = TYPE_INVALID;
        auStack_480._4_4_ = PRECISION_LOWP;
      }
      if ((undefined **)local_450._0_8_ != ppuVar27) {
        operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
      }
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                 *)local_4b8);
      local_4a8[0x1f] = '\x01';
      goto LAB_0144e9fb;
    }
  }
  local_450._0_8_ = ppuVar27;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"in_te_s","");
  Variable::Variable((Variable *)local_3b0,(string *)local_450,(VarType *)local_3d0,
                     this->m_ioType != IO_TYPE_PER_PATCH);
  if ((undefined **)local_450._0_8_ != ppuVar27) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  local_4b8._0_8_ = (pointer)local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"in_te_f","");
  Variable::Variable((Variable *)local_450,(string *)local_4b8,(VarType *)&local_210,
                     this->m_ioType != IO_TYPE_PER_PATCH);
  if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
  }
  local_4a8[0x1f] = this->m_ioType != IO_TYPE_PER_PATCH_ARRAY;
  if ((bool)local_4a8[0x1f]) {
    pMVar17 = (pointer)operator_new(0x48);
    (pMVar17->name)._M_dataplus._M_p = (pointer)&PTR__Variable_0219c310;
    (pMVar17->name)._M_string_length = (size_type)((long)&(pMVar17->name).field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pMVar17->name)._M_string_length,local_3b0._8_8_,
               (undefined1 *)((long)(Type *)local_3b0._8_8_ + local_3a0._0_8_));
    glu::VarType::VarType((VarType *)&(pMVar17->type).m_data.basic,(VarType *)(local_390 + 8));
    *(bool *)&pMVar17[1].name._M_string_length = local_370;
    local_4b8._8_8_ = (pointer)0x0;
    local_4b8._0_8_ = pMVar17;
    pMVar18 = (pointer)operator_new(0x20);
    *(undefined4 *)&(pMVar18->name)._M_string_length = 0;
    *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 0;
    (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_0219c2d0;
    (pMVar18->name).field_2._M_allocated_capacity = (size_type)pMVar17;
    *(undefined4 *)&(pMVar18->name)._M_string_length = 1;
    *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 1;
    local_4b8._8_8_ = pMVar18;
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&local_458->m_tcsOutputs,(value_type *)local_4b8);
    psVar24 = &(pMVar18->name)._M_string_length;
    LOCK();
    *(int *)psVar24 = (int)*psVar24 + -1;
    UNLOCK();
    if ((int)*psVar24 == 0) {
      local_4b8._0_8_ = (pointer)0x0;
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))();
    }
    LOCK();
    piVar35 = (int *)((long)&((string *)local_4b8._8_8_)->_M_string_length + 4);
    *piVar35 = *piVar35 + -1;
    UNLOCK();
    if (*piVar35 == 0) {
      if ((pointer)local_4b8._8_8_ != (pointer)0x0) {
        (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
      }
      local_4b8._8_8_ = (pointer)0x0;
    }
    pMVar17 = (pointer)operator_new(0x48);
    (pMVar17->name)._M_dataplus._M_p = (pointer)&PTR__Variable_0219c310;
    (pMVar17->name)._M_string_length = (size_type)((long)&(pMVar17->name).field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pMVar17->name)._M_string_length,local_3b0._8_8_,
               (undefined1 *)((long)(Type *)local_3b0._8_8_ + local_3a0._0_8_));
    glu::VarType::VarType((VarType *)&(pMVar17->type).m_data.basic,(VarType *)(local_390 + 8));
    *(bool *)&pMVar17[1].name._M_string_length = local_370;
    local_4b8._8_8_ = (pointer)0x0;
    local_4b8._0_8_ = pMVar17;
    pMVar18 = (pointer)operator_new(0x20);
    *(undefined4 *)&(pMVar18->name)._M_string_length = 0;
    *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 0;
    (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_0219c2d0;
    (pMVar18->name).field_2._M_allocated_capacity = (size_type)pMVar17;
    *(undefined4 *)&(pMVar18->name)._M_string_length = 1;
    *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 1;
    local_4b8._8_8_ = pMVar18;
    std::
    vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
    ::push_back(&local_458->m_tesInputs,(value_type *)local_4b8);
    psVar24 = &(pMVar18->name)._M_string_length;
    LOCK();
    *(int *)psVar24 = (int)*psVar24 + -1;
    UNLOCK();
    if ((int)*psVar24 == 0) {
      local_4b8._0_8_ = (pointer)0x0;
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))();
    }
    LOCK();
    piVar35 = (int *)((long)&((string *)local_4b8._8_8_)->_M_string_length + 4);
    *piVar35 = *piVar35 + -1;
    UNLOCK();
    if (*piVar35 == 0) {
      if ((pointer)local_4b8._8_8_ != (pointer)0x0) {
        (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
      }
      local_4b8._8_8_ = (pointer)0x0;
    }
  }
  pMVar17 = (pointer)operator_new(0x48);
  (pMVar17->name)._M_dataplus._M_p = (pointer)&PTR__Variable_0219c310;
  (pMVar17->name)._M_string_length = (size_type)((long)&(pMVar17->name).field_2 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pMVar17->name)._M_string_length,local_450._8_8_,
             (char *)(local_450._8_8_ + local_450._16_8_));
  glu::VarType::VarType((VarType *)&(pMVar17->type).m_data.basic,&local_428);
  *(bool *)&pMVar17[1].name._M_string_length = local_410;
  local_4b8._8_8_ = (pointer)0x0;
  local_4b8._0_8_ = pMVar17;
  pMVar18 = (pointer)operator_new(0x20);
  *(undefined4 *)&(pMVar18->name)._M_string_length = 0;
  *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 0;
  (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_0219c2d0;
  (pMVar18->name).field_2._M_allocated_capacity = (size_type)pMVar17;
  *(undefined4 *)&(pMVar18->name)._M_string_length = 1;
  *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 1;
  local_4b8._8_8_ = pMVar18;
  std::
  vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ::push_back(&local_458->m_tcsOutputs,(value_type *)local_4b8);
  psVar24 = &(pMVar18->name)._M_string_length;
  LOCK();
  *(int *)psVar24 = (int)*psVar24 + -1;
  UNLOCK();
  if ((int)*psVar24 == 0) {
    local_4b8._0_8_ = (pointer)0x0;
    (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))();
  }
  LOCK();
  piVar35 = (int *)((long)&((string *)local_4b8._8_8_)->_M_string_length + 4);
  *piVar35 = *piVar35 + -1;
  UNLOCK();
  if (*piVar35 == 0) {
    if ((pointer)local_4b8._8_8_ != (pointer)0x0) {
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
    }
    local_4b8._8_8_ = (pointer)0x0;
  }
  pMVar17 = (pointer)operator_new(0x48);
  (pMVar17->name)._M_dataplus._M_p = (pointer)&PTR__Variable_0219c310;
  (pMVar17->name)._M_string_length = (size_type)((long)&(pMVar17->name).field_2 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pMVar17->name)._M_string_length,local_450._8_8_,
             (char *)(local_450._8_8_ + local_450._16_8_));
  glu::VarType::VarType((VarType *)&(pMVar17->type).m_data.basic,&local_428);
  *(bool *)&pMVar17[1].name._M_string_length = local_410;
  local_4b8._8_8_ = (pointer)0x0;
  local_4b8._0_8_ = pMVar17;
  pMVar18 = (pointer)operator_new(0x20);
  *(undefined4 *)&(pMVar18->name)._M_string_length = 0;
  *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 0;
  (pMVar18->name)._M_dataplus._M_p = (pointer)&PTR__SharedPtrState_0219c2d0;
  (pMVar18->name).field_2._M_allocated_capacity = (size_type)pMVar17;
  *(undefined4 *)&(pMVar18->name)._M_string_length = 1;
  *(undefined4 *)((long)&(pMVar18->name)._M_string_length + 4) = 1;
  local_4b8._8_8_ = pMVar18;
  std::
  vector<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
  ::push_back(&local_458->m_tesInputs,(value_type *)local_4b8);
  psVar24 = &(pMVar18->name)._M_string_length;
  LOCK();
  *(int *)psVar24 = (int)*psVar24 + -1;
  UNLOCK();
  if ((int)*psVar24 == 0) {
    local_4b8._0_8_ = (pointer)0x0;
    (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 0x10))();
  }
  LOCK();
  piVar35 = (int *)((long)&((string *)local_4b8._8_8_)->_M_string_length + 4);
  *piVar35 = *piVar35 + -1;
  UNLOCK();
  if (*piVar35 == 0) {
    if ((pointer)local_4b8._8_8_ != (pointer)0x0) {
      (**(code **)((((string *)local_4b8._8_8_)->_M_dataplus)._M_p + 8))();
    }
    local_4b8._8_8_ = (pointer)0x0;
  }
  local_450._0_8_ = &PTR__Variable_0219c310;
  glu::VarType::~VarType(&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._8_8_ != &aStack_438) {
    operator_delete((void *)local_450._8_8_,aStack_438._0_8_ + 1);
  }
  local_3b0._0_8_ = &PTR__Variable_0219c310;
  glu::VarType::~VarType((VarType *)(local_390 + 8));
  this = local_458;
  if (local_3b0._8_8_ != (long)local_3a0 + 8) {
    operator_delete((void *)local_3b0._8_8_,local_3a0._8_8_ + 1);
    this = local_458;
  }
LAB_0144e9fb:
  pTVar29 = (TopLevelObject *)(auStack_480 + 8);
  local_488 = (undefined1  [8])pTVar29;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"in_tc_attr","");
  Variable::Variable((Variable *)local_3b0,(string *)local_488,(VarType *)&local_210,true);
  Variable::declareArray((string *)local_4b8,(Variable *)local_3b0,(string *)(local_140 + 0x10));
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1a85b6f);
  plVar19 = plVar13 + 2;
  if ((long *)*plVar13 == plVar19) {
    local_450._16_8_ = *plVar19;
    aStack_438._M_allocated_capacity = plVar13[3];
    local_450._0_8_ = local_450 + 0x10;
  }
  else {
    local_450._16_8_ = *plVar19;
    local_450._0_8_ = (long *)*plVar13;
  }
  local_450._8_8_ = plVar13[1];
  *plVar13 = (long)plVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_160._M_left,local_450._0_8_);
  if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
    operator_delete((void *)local_450._0_8_,(ulong)(local_450._16_8_ + 1));
  }
  if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
  }
  local_3b0._0_8_ = &PTR__Variable_0219c310;
  glu::VarType::~VarType((VarType *)(local_390 + 8));
  if (local_3b0._8_8_ != (long)local_3a0 + 8) {
    operator_delete((void *)local_3b0._8_8_,local_3a0._8_8_ + 1);
  }
  if (local_488 != (undefined1  [8])pTVar29) {
    operator_delete((void *)local_488,(ulong)(auStack_480._8_8_ + 1));
  }
  if (local_4a8[0x1f] != '\0') {
    glu::decl::DeclareStructType::DeclareStructType((DeclareStructType *)local_450,local_400,0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    glu::decl::operator<<((ostream *)local_3b0,(DeclareStructType *)local_450);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    plVar13 = (long *)std::__cxx11::string::append(local_488);
    pMVar17 = (pointer)(plVar13 + 2);
    if ((pointer)*plVar13 == pMVar17) {
      local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
      local_4a8._8_8_ = plVar13[3];
      local_4b8._0_8_ = (pointer)local_4a8;
    }
    else {
      local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
      local_4b8._0_8_ = (pointer)*plVar13;
    }
    local_4b8._8_8_ = plVar13[1];
    *plVar13 = (long)pMVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_160._M_left,local_4b8._0_8_);
    if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
      operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    }
    if (local_488 != (undefined1  [8])pTVar29) {
      operator_delete((void *)local_488,(ulong)(auStack_480._8_8_ + 1));
    }
    glu::StructType::~StructType((StructType *)local_450);
  }
  std::__cxx11::string::append(local_1e0 + 0x10);
  pSVar20 = (this->m_tcsOutputs).
            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_tcsOutputs).
                              super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20) >> 4)) {
    lVar36 = 0;
    lVar40 = 0;
    do {
      iVar12 = -1;
      if (local_404 < IO_TYPE_PER_VERTEX) {
        IVar6 = local_458->m_ioType;
        if ((ulong)IVar6 < 3) {
          iVar12 = *(int *)(&DAT_01c7c900 + (ulong)IVar6 * 4);
        }
        else {
          iVar12 = (uint)(IVar6 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
        }
      }
      plVar13 = *(long **)((long)&pSVar20->m_ptr + lVar36);
      if (iVar12 == 1) {
        (**(code **)(*plVar13 + 0x18))(local_450);
        plVar19 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_450,0,(char *)0x0,(ulong)local_170);
        local_3b0._0_8_ = local_3a0;
        ppuVar27 = (undefined **)(plVar19 + 2);
        if ((undefined **)*plVar19 == ppuVar27) {
          local_3a0._0_8_ = *ppuVar27;
          local_3a0._8_8_ = plVar19[3];
        }
        else {
          local_3a0._0_8_ = *ppuVar27;
          local_3b0._0_8_ = (undefined **)*plVar19;
        }
        local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar19 + 1);
        *plVar19 = (long)ppuVar27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_160._M_left,local_3b0._0_8_);
        if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        puVar38 = (undefined1 *)local_450._16_8_;
        auVar39 = (undefined1  [8])local_450._0_8_;
        if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
LAB_0144efb8:
          operator_delete((void *)auVar39,(ulong)(puVar38 + 1));
        }
      }
      else {
        if (local_458->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::ostream::operator<<((ostringstream *)local_3b0,2);
          std::__cxx11::stringbuf::str();
LAB_0144eec4:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
        }
        else {
          if (local_458->m_ioType == IO_TYPE_PER_PATCH_ARRAY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::ostream::operator<<((ostringstream *)local_3b0,3);
            std::__cxx11::stringbuf::str();
            goto LAB_0144eec4;
          }
          TVar7 = local_458->m_tessControlOutArraySize;
          if (TVar7 == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY) {
            pCVar8 = ((local_458->super_TestCase).m_context)->m_contextInfo;
            iVar11 = (*pCVar8->_vptr_ContextInfo[2])(pCVar8,0x8e7d);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::ostream::operator<<((ostringstream *)local_3b0,iVar11);
            std::__cxx11::stringbuf::str();
            goto LAB_0144eec4;
          }
          if (TVar7 == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::ostream::operator<<((ostringstream *)local_3b0,5);
            std::__cxx11::stringbuf::str();
            goto LAB_0144eec4;
          }
          pcVar33 = "";
          if (TVar7 == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN) {
            pcVar33 = "gl_MaxPatchVertices";
          }
          local_488 = (undefined1  [8])(auStack_480 + 8);
          pcVar37 = pcVar33 + 0x13;
          if (TVar7 != TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN) {
            pcVar37 = pcVar33;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_488,pcVar33,pcVar37);
        }
        (**(code **)(*plVar13 + 0x20))(local_4b8,plVar13,local_488);
        plVar19 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_4b8,0,(char *)0x0,(ulong)local_170);
        local_450._0_8_ = local_450 + 0x10;
        plVar28 = plVar19 + 2;
        if ((long *)*plVar19 == plVar28) {
          local_450._16_8_ = *plVar28;
          aStack_438._M_allocated_capacity = plVar19[3];
        }
        else {
          local_450._16_8_ = *plVar28;
          local_450._0_8_ = (long *)*plVar19;
        }
        local_450._8_8_ = plVar19[1];
        *plVar19 = (long)plVar28;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_160._M_left,local_450._0_8_);
        if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
          operator_delete((void *)local_450._0_8_,(ulong)(local_450._16_8_ + 1));
        }
        if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
          operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
        }
        puVar38 = (undefined1 *)auStack_480._8_8_;
        auVar39 = local_488;
        if (local_488 != (undefined1  [8])(auStack_480 + 8)) goto LAB_0144efb8;
      }
      if (IO_TYPE_PER_PATCH_BLOCK_ARRAY < local_404) {
        iVar11 = (**(code **)(*plVar13 + 0x38))(plVar13);
        de::floatToString_abi_cxx11_
                  ((string *)local_4b8,(de *)&DAT_00000001,(float)iVar11 * 0.4,precision);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1c84b2c);
        local_450._0_8_ = local_450 + 0x10;
        plVar28 = plVar19 + 2;
        if ((long *)*plVar19 == plVar28) {
          local_450._16_8_ = *plVar28;
          aStack_438._M_allocated_capacity = plVar19[3];
        }
        else {
          local_450._16_8_ = *plVar28;
          local_450._0_8_ = (long *)*plVar19;
        }
        local_450._8_8_ = plVar19[1];
        *plVar19 = (long)plVar28;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append(local_450);
        local_3b0._0_8_ = local_3a0;
        ppuVar27 = (undefined **)(plVar19 + 2);
        if ((undefined **)*plVar19 == ppuVar27) {
          local_3a0._0_8_ = *ppuVar27;
          local_3a0._8_8_ = plVar19[3];
        }
        else {
          local_3a0._0_8_ = *ppuVar27;
          local_3b0._0_8_ = (undefined **)*plVar19;
        }
        local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar19 + 1);
        *plVar19 = (long)ppuVar27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::string::_M_append(local_1e0 + 0x10,local_3b0._0_8_);
        if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
          operator_delete((void *)local_450._0_8_,(ulong)(local_450._16_8_ + 1));
        }
        if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
          operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
        }
      }
      (**(code **)(*plVar13 + 0x10))(local_4b8);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1c84b4b);
      local_450._0_8_ = local_450 + 0x10;
      plVar28 = plVar19 + 2;
      if ((long *)*plVar19 == plVar28) {
        local_450._16_8_ = *plVar28;
        aStack_438._M_allocated_capacity = plVar19[3];
      }
      else {
        local_450._16_8_ = *plVar28;
        local_450._0_8_ = (long *)*plVar19;
      }
      local_450._8_8_ = plVar19[1];
      *plVar19 = (long)plVar28;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_450);
      local_3b0._0_8_ = local_3a0;
      ppuVar27 = (undefined **)(plVar19 + 2);
      if ((undefined **)*plVar19 == ppuVar27) {
        local_3a0._0_8_ = *ppuVar27;
        local_3a0._8_8_ = plVar19[3];
      }
      else {
        local_3a0._0_8_ = *ppuVar27;
        local_3b0._0_8_ = (undefined **)*plVar19;
      }
      local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar19 + 1);
      *plVar19 = (long)ppuVar27;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      std::__cxx11::string::_M_append(local_1e0 + 0x10,local_3b0._0_8_);
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
        operator_delete((void *)local_450._0_8_,(ulong)(local_450._16_8_ + 1));
      }
      if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
        operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
      }
      if (iVar12 == 1) {
        (**(code **)(*plVar13 + 0x30))((string *)local_3b0,plVar13,2,glslAssignBasicTypeObject);
        std::__cxx11::string::_M_append(local_1e0 + 0x10,local_3b0._0_8_);
      }
      else {
        (**(code **)(*plVar13 + 0x28))
                  ((string *)local_3b0,plVar13,iVar12,2,glslAssignBasicTypeObject);
        std::__cxx11::string::_M_append(local_1e0 + 0x10,local_3b0._0_8_);
      }
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      if (IO_TYPE_PER_PATCH_BLOCK_ARRAY < local_404) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::ostream::operator<<((string *)local_3b0,5);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        plVar19 = (long *)std::__cxx11::string::replace((ulong)local_1f0,0,(char *)0x0,0x1c84b6a);
        local_3f8 = &local_3f0._M_string_length;
        psVar24 = (size_type *)(plVar19 + 2);
        if ((size_type *)*plVar19 == psVar24) {
          local_3f0._M_string_length = *psVar24;
          local_3f0.field_2._M_allocated_capacity = plVar19[3];
        }
        else {
          local_3f0._M_string_length = *psVar24;
          local_3f8 = (size_type *)*plVar19;
        }
        local_3f0._M_dataplus._M_p = (pointer)plVar19[1];
        *plVar19 = (long)psVar24;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        plVar19 = (long *)std::__cxx11::string::append((char *)&local_3f8);
        local_488 = (undefined1  [8])(auStack_480 + 8);
        pTVar29 = (TopLevelObject *)(plVar19 + 2);
        if ((TopLevelObject *)*plVar19 == pTVar29) {
          auStack_480._8_8_ = pTVar29->_vptr_TopLevelObject;
          aStack_470._M_allocated_capacity = plVar19[3];
        }
        else {
          auStack_480._8_8_ = pTVar29->_vptr_TopLevelObject;
          local_488 = (undefined1  [8])*plVar19;
        }
        auStack_480._0_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar19 + 1);
        *plVar19 = (long)pTVar29;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        iVar12 = (**(code **)(*plVar13 + 0x38))(plVar13);
        de::floatToString_abi_cxx11_
                  ((string *)local_3b0,(de *)&DAT_00000001,(float)iVar12 * 0.4,precision_00);
        puVar38 = (undefined1 *)0xf;
        if (local_488 != (undefined1  [8])(auStack_480 + 8)) {
          puVar38 = (undefined1 *)auStack_480._8_8_;
        }
        puVar3 = (undefined1 *)((long)(Type *)local_3b0._8_8_ + auStack_480._0_8_);
        if (puVar38 < puVar3) {
          puVar38 = (undefined1 *)0xf;
          if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
            puVar38 = (undefined1 *)local_3a0._0_8_;
          }
          if (puVar38 < puVar3) goto LAB_0144f4bc;
          plVar13 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_3b0,0,(char *)0x0,(ulong)local_488);
        }
        else {
LAB_0144f4bc:
          plVar13 = (long *)std::__cxx11::string::_M_append(local_488,local_3b0._0_8_);
        }
        local_4b8._0_8_ = local_4a8;
        pMVar17 = (pointer)(plVar13 + 2);
        if ((pointer)*plVar13 == pMVar17) {
          local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
          local_4a8._8_8_ = plVar13[3];
        }
        else {
          local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
          local_4b8._0_8_ = (pointer)*plVar13;
        }
        local_4b8._8_8_ = plVar13[1];
        *plVar13 = (long)pMVar17;
        plVar13[1] = 0;
        *(undefined1 *)&(pMVar17->name)._M_dataplus._M_p = 0;
        plVar13 = (long *)std::__cxx11::string::append(local_4b8);
        plVar19 = plVar13 + 2;
        if ((long *)*plVar13 == plVar19) {
          local_450._16_8_ = *plVar19;
          aStack_438._M_allocated_capacity = plVar13[3];
          local_450._0_8_ = local_450 + 0x10;
        }
        else {
          local_450._16_8_ = *plVar19;
          local_450._0_8_ = (long *)*plVar13;
        }
        local_450._8_8_ = plVar13[1];
        *plVar13 = (long)plVar19;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::_M_append(local_1e0 + 0x10,local_450._0_8_);
        if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
          operator_delete((void *)local_450._0_8_,(ulong)(local_450._16_8_ + 1));
        }
        if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
          operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
        }
        if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        if (local_488 != (undefined1  [8])(auStack_480 + 8)) {
          operator_delete((void *)local_488,(ulong)(auStack_480._8_8_ + 1));
        }
        if (local_3f8 != &local_3f0._M_string_length) {
          operator_delete(local_3f8,local_3f0._M_string_length + 1);
        }
        if (local_1f0[0] != (ContextInfo *)local_1e0) {
          operator_delete(local_1f0[0],local_1e0._0_8_ + 1);
        }
      }
      lVar40 = lVar40 + 1;
      pSVar20 = (local_458->m_tcsOutputs).
                super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar36 = lVar36 + 0x10;
    } while (lVar40 < (int)((ulong)((long)(local_458->m_tcsOutputs).
                                          super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20
                                   ) >> 4));
  }
  std::__cxx11::string::append(local_1e0 + 0x10);
  pUVar41 = local_458;
  if (local_4a8[0x1f] != '\0') {
    glu::decl::DeclareStructType::DeclareStructType((DeclareStructType *)local_450,local_400,0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    glu::decl::operator<<((ostream *)local_3b0,(DeclareStructType *)local_450);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    plVar13 = (long *)std::__cxx11::string::append(local_488);
    pMVar17 = (pointer)(plVar13 + 2);
    if ((pointer)*plVar13 == pMVar17) {
      local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
      local_4a8._8_8_ = plVar13[3];
      local_4b8._0_8_ = (pointer)local_4a8;
    }
    else {
      local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
      local_4b8._0_8_ = (pointer)*plVar13;
    }
    local_4b8._8_8_ = plVar13[1];
    *plVar13 = (long)pMVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_110,local_4b8._0_8_);
    if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
      operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    }
    if (local_488 != (undefined1  [8])(auStack_480 + 8)) {
      operator_delete((void *)local_488,(ulong)(auStack_480._8_8_ + 1));
    }
    glu::StructType::~StructType((StructType *)local_450);
  }
  std::__cxx11::string::append(local_1b0._M_local_buf);
  pSVar20 = (pUVar41->m_tesInputs).
            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar41->m_tesInputs).
                              super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20) >> 4)) {
    local_234 = local_234 - VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN;
    lVar36 = 0;
    lVar40 = 0;
    do {
      iVar12 = 5;
      if (local_404 < IO_TYPE_PER_VERTEX) {
        IVar6 = local_458->m_ioType;
        if ((ulong)IVar6 < 3) {
          iVar12 = *(int *)(&DAT_01c7c900 + (ulong)IVar6 * 4);
        }
        else {
          iVar12 = (uint)(IVar6 == IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 4 + -2;
        }
      }
      plVar13 = *(long **)((long)&pSVar20->m_ptr + lVar36);
      local_400 = (StructType *)CONCAT44(local_400._4_4_,iVar12);
      if (iVar12 == 1) {
        (**(code **)(*plVar13 + 0x18))(local_450);
        plVar19 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_450,0,(char *)0x0,(ulong)local_190);
        local_3b0._0_8_ = local_3a0;
        ppuVar27 = (undefined **)(plVar19 + 2);
        if ((undefined **)*plVar19 == ppuVar27) {
          local_3a0._0_8_ = *ppuVar27;
          local_3a0._8_8_ = plVar19[3];
        }
        else {
          local_3a0._0_8_ = *ppuVar27;
          local_3b0._0_8_ = (undefined **)*plVar19;
        }
        local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar19 + 1);
        *plVar19 = (long)ppuVar27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_110,local_3b0._0_8_);
        if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
          operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
        }
        puVar38 = (undefined1 *)local_450._16_8_;
        auVar39 = (undefined1  [8])local_450._0_8_;
        if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
LAB_0144fb0f:
          operator_delete((void *)auVar39,(ulong)(puVar38 + 1));
        }
      }
      else {
        if (local_458->m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::ostream::operator<<((ostringstream *)local_3b0,2);
          std::__cxx11::stringbuf::str();
LAB_0144fa23:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
        }
        else {
          if (local_458->m_ioType == IO_TYPE_PER_PATCH_ARRAY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::ostream::operator<<((ostringstream *)local_3b0,3);
            std::__cxx11::stringbuf::str();
            goto LAB_0144fa23;
          }
          if (local_234 < VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b0,local_130._M_dataplus._M_p,local_130._M_string_length);
            std::__cxx11::stringbuf::str();
            goto LAB_0144fa23;
          }
          local_488 = (undefined1  [8])(auStack_480 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_488,0x1b32ab9);
        }
        (**(code **)(*plVar13 + 0x20))(local_4b8,plVar13,local_488);
        plVar19 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_4b8,0,(char *)0x0,(ulong)local_190);
        local_450._0_8_ = local_450 + 0x10;
        plVar28 = plVar19 + 2;
        if ((long *)*plVar19 == plVar28) {
          local_450._16_8_ = *plVar28;
          aStack_438._M_allocated_capacity = plVar19[3];
        }
        else {
          local_450._16_8_ = *plVar28;
          local_450._0_8_ = (long *)*plVar19;
        }
        local_450._8_8_ = plVar19[1];
        *plVar19 = (long)plVar28;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_110,local_450._0_8_);
        if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
          operator_delete((void *)local_450._0_8_,(ulong)(local_450._16_8_ + 1));
        }
        if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
          operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
        }
        puVar38 = (undefined1 *)auStack_480._8_8_;
        auVar39 = local_488;
        if (local_488 != (undefined1  [8])(auStack_480 + 8)) goto LAB_0144fb0f;
      }
      (**(code **)(*plVar13 + 0x10))(local_4b8);
      plVar19 = (long *)std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,0x1c84be4);
      local_450._0_8_ = local_450 + 0x10;
      plVar28 = plVar19 + 2;
      if ((long *)*plVar19 == plVar28) {
        local_450._16_8_ = *plVar28;
        aStack_438._M_allocated_capacity = plVar19[3];
      }
      else {
        local_450._16_8_ = *plVar28;
        local_450._0_8_ = (long *)*plVar19;
      }
      local_450._8_8_ = plVar19[1];
      *plVar19 = (long)plVar28;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      plVar19 = (long *)std::__cxx11::string::append(local_450);
      local_3b0._0_8_ = local_3a0;
      ppuVar27 = (undefined **)(plVar19 + 2);
      if ((undefined **)*plVar19 == ppuVar27) {
        local_3a0._0_8_ = *ppuVar27;
        local_3a0._8_8_ = plVar19[3];
      }
      else {
        local_3a0._0_8_ = *ppuVar27;
        local_3b0._0_8_ = (undefined **)*plVar19;
      }
      local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar19 + 1);
      *plVar19 = (long)ppuVar27;
      plVar19[1] = 0;
      *(undefined1 *)(plVar19 + 2) = 0;
      std::__cxx11::string::_M_append(local_1b0._M_local_buf,local_3b0._0_8_);
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      if ((undefined1 *)local_450._0_8_ != local_450 + 0x10) {
        operator_delete((void *)local_450._0_8_,(ulong)(local_450._16_8_ + 1));
      }
      if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
        operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
      }
      if ((int)local_400 == 1) {
        (**(code **)(*plVar13 + 0x30))(local_3b0,plVar13,2,glslCheckBasicTypeObject);
        pUVar41 = local_458;
        std::__cxx11::string::_M_append(local_1b0._M_local_buf,local_3b0._0_8_);
      }
      else {
        (**(code **)(*plVar13 + 0x28))
                  (local_3b0,plVar13,(ulong)local_400 & 0xffffffff,2,glslCheckBasicTypeObject);
        std::__cxx11::string::_M_append(local_1b0._M_local_buf,local_3b0._0_8_);
        pUVar41 = local_458;
      }
      if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._0_8_ + 1));
      }
      lVar40 = lVar40 + 1;
      pSVar20 = (pUVar41->m_tesInputs).
                super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar36 = lVar36 + 0x10;
    } while (lVar40 < (int)((ulong)((long)(pUVar41->m_tesInputs).
                                          super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20
                                   ) >> 4));
  }
  std::__cxx11::string::append(local_1b0._M_local_buf);
  pcVar4 = local_450 + 0x10;
  glu::VarType::~VarType((VarType *)local_3d0);
  glu::VarType::~VarType((VarType *)&local_210);
  local_1f0[0] = (ContextInfo *)local_1e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f0,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  pTVar29 = (TopLevelObject *)(auStack_480 + 8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::ostream::operator<<(local_3b0,5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_230,0,(char *)0x0,0x1c7f2d7);
  pCVar9 = (Context *)(local_3d0 + 0x10);
  pCVar32 = (Context *)(plVar13 + 2);
  if ((Context *)*plVar13 == pCVar32) {
    local_3d0._16_8_ = pCVar32->m_testCtx;
    lStack_3b8 = plVar13[3];
    local_3d0._0_8_ = pCVar9;
  }
  else {
    local_3d0._16_8_ = pCVar32->m_testCtx;
    local_3d0._0_8_ = (Context *)*plVar13;
  }
  local_3d0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)pCVar32;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_3d0);
  psVar24 = &local_3f0._M_string_length;
  psVar30 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar30) {
    local_3f0._M_string_length = *psVar30;
    local_3f0.field_2._M_allocated_capacity = plVar13[3];
    local_3f8 = psVar24;
  }
  else {
    local_3f0._M_string_length = *psVar30;
    local_3f8 = (size_type *)*plVar13;
  }
  local_3f0._M_dataplus._M_p = (pointer)plVar13[1];
  *plVar13 = (long)psVar30;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_160._M_left);
  pTVar31 = (TopLevelObject *)(plVar13 + 2);
  if ((TopLevelObject *)*plVar13 == pTVar31) {
    auStack_480._8_8_ = pTVar31->_vptr_TopLevelObject;
    aStack_470._M_allocated_capacity = plVar13[3];
    local_488 = (undefined1  [8])pTVar29;
  }
  else {
    auStack_480._8_8_ = pTVar31->_vptr_TopLevelObject;
    local_488 = (undefined1  [8])*plVar13;
  }
  auStack_480._0_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)pTVar31;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_488);
  pMVar17 = (pointer)(plVar13 + 2);
  if ((pointer)*plVar13 == pMVar17) {
    local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
    local_4a8._8_8_ = plVar13[3];
    local_4b8._0_8_ = (pointer)local_4a8;
  }
  else {
    local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
    local_4b8._0_8_ = (pointer)*plVar13;
  }
  local_4b8._8_8_ = plVar13[1];
  *plVar13 = (long)pMVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::_M_append(local_4b8,local_1e0._16_8_);
  psVar30 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar30) {
    local_450._16_8_ = *psVar30;
    aStack_438._M_allocated_capacity = plVar13[3];
    local_450._0_8_ = pcVar4;
  }
  else {
    local_450._16_8_ = *psVar30;
    local_450._0_8_ = (size_type *)*plVar13;
  }
  local_450._8_8_ = plVar13[1];
  *plVar13 = (long)psVar30;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_450);
  local_210 = (Context *)(local_208 + 8);
  pCVar32 = (Context *)(plVar13 + 2);
  if ((Context *)*plVar13 == pCVar32) {
    local_208._8_8_ = pCVar32->m_testCtx;
    lStack_1f8 = plVar13[3];
  }
  else {
    local_208._8_8_ = pCVar32->m_testCtx;
    local_210 = (Context *)*plVar13;
  }
  aVar16 = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)pCVar32;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_208._0_8_ = aVar16;
  if ((pointer)local_450._0_8_ != pcVar4) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
    aVar16 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar32,0);
  primType = aVar16.type;
  if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    primType = extraout_EDX;
  }
  if (local_488 != (undefined1  [8])pTVar29) {
    operator_delete((void *)local_488,auStack_480._8_8_ + 1);
    primType = extraout_EDX_00;
  }
  if (local_3f8 != psVar24) {
    operator_delete(local_3f8,local_3f0._M_string_length + 1);
    primType = extraout_EDX_01;
  }
  if ((Context *)local_3d0._0_8_ != pCVar9) {
    operator_delete((void *)local_3d0._0_8_,(ulong)(local_3d0._16_8_ + 1));
    primType = extraout_EDX_02;
  }
  if ((Context *)local_230._0_8_ != (Context *)(local_230 + 0x10)) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    primType = extraout_EDX_03;
  }
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_230,(_anonymous_namespace_ *)(ulong)pUVar41->m_primitiveType,primType,
             (bool)usePointMode);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_230,0,(char *)0x0,0x1c7e9cf);
  psVar30 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar30) {
    local_3f0._M_string_length = *psVar30;
    local_3f0.field_2._M_allocated_capacity = plVar13[3];
    local_3f8 = psVar24;
  }
  else {
    local_3f0._M_string_length = *psVar30;
    local_3f8 = (size_type *)*plVar13;
  }
  local_3f0._M_dataplus._M_p = (pointer)plVar13[1];
  *plVar13 = (long)psVar30;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_3f8);
  pTVar31 = (TopLevelObject *)(plVar13 + 2);
  if ((TopLevelObject *)*plVar13 == pTVar31) {
    auStack_480._8_8_ = pTVar31->_vptr_TopLevelObject;
    aStack_470._M_allocated_capacity = plVar13[3];
    local_488 = (undefined1  [8])pTVar29;
  }
  else {
    auStack_480._8_8_ = pTVar31->_vptr_TopLevelObject;
    local_488 = (undefined1  [8])*plVar13;
  }
  auStack_480._0_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)pTVar31;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::_M_append(local_488,(ulong)local_110);
  pMVar17 = (pointer)(plVar13 + 2);
  if ((pointer)*plVar13 == pMVar17) {
    local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
    local_4a8._8_8_ = plVar13[3];
    local_4b8._0_8_ = (pointer)local_4a8;
  }
  else {
    local_4a8._0_8_ = (pMVar17->name)._M_dataplus._M_p;
    local_4b8._0_8_ = (pointer)*plVar13;
  }
  local_4b8._8_8_ = plVar13[1];
  *plVar13 = (long)pMVar17;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_4b8);
  psVar30 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar30) {
    local_450._16_8_ = *psVar30;
    aStack_438._M_allocated_capacity = plVar13[3];
    local_450._0_8_ = pcVar4;
  }
  else {
    local_450._16_8_ = *psVar30;
    local_450._0_8_ = (size_type *)*plVar13;
  }
  local_450._8_8_ = plVar13[1];
  *plVar13 = (long)psVar30;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::_M_append(local_450,local_1b0._M_allocated_capacity);
  local_3b0._0_8_ = local_3a0;
  psVar30 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar30) {
    local_3a0._0_8_ = *psVar30;
    local_3a0._8_8_ = plVar13[3];
  }
  else {
    local_3a0._0_8_ = *psVar30;
    local_3b0._0_8_ = (size_type *)*plVar13;
  }
  local_3b0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)psVar30;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_3b0);
  pCVar32 = (Context *)(plVar13 + 2);
  if ((Context *)*plVar13 == pCVar32) {
    local_3d0._16_8_ = pCVar32->m_testCtx;
    lStack_3b8 = plVar13[3];
    local_3d0._0_8_ = pCVar9;
  }
  else {
    local_3d0._16_8_ = pCVar32->m_testCtx;
    local_3d0._0_8_ = (Context *)*plVar13;
  }
  local_3d0._8_8_ = *(anon_struct_8_2_bfd9d0cb_for_basic *)(plVar13 + 1);
  *plVar13 = (long)pCVar32;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  if ((undefined1 *)local_3b0._0_8_ != local_3a0) {
    operator_delete((void *)local_3b0._0_8_,local_3a0._0_8_ + 1);
  }
  if ((pointer)local_450._0_8_ != pcVar4) {
    operator_delete((void *)local_450._0_8_,local_450._16_8_ + 1);
  }
  if ((pointer)local_4b8._0_8_ != (pointer)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
  }
  if (local_488 != (undefined1  [8])pTVar29) {
    operator_delete((void *)local_488,auStack_480._8_8_ + 1);
  }
  if (local_3f8 != psVar24) {
    operator_delete(local_3f8,local_3f0._M_string_length + 1);
  }
  if ((Context *)local_230._0_8_ != (Context *)(local_230 + 0x10)) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  local_230._0_8_ = (Context *)(local_230 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar9 = (pUVar41->super_TestCase).m_context;
  renderCtx = pCVar9->m_renderCtx;
  local_300[0x10] = 0;
  local_300._17_8_ = 0;
  local_300._0_8_ = (pointer)0x0;
  local_300[8] = 0;
  local_300._9_7_ = 0;
  memset(local_3b0,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)pCVar9,(Context *)local_1f0[0],(char *)pCVar32);
  local_450._0_8_ = local_450._0_8_ & 0xffffffff00000000;
  local_450._8_8_ = &aStack_438;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_450 + 8),local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3b0 + (local_450._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_450 + 8));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)(pUVar41->super_TestCase).m_context,local_210,
             (char *)pCVar32);
  local_4b8._0_4_ = 3;
  local_4b8._8_8_ = local_4a8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4b8 + 8),local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3b0 + (local_4b8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_4b8 + 8));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_90,(_anonymous_namespace_ *)(pUVar41->super_TestCase).m_context,
             (Context *)local_3d0._0_8_,(char *)pCVar32);
  local_488._0_4_ = 4;
  auStack_480._0_8_ = &aStack_470;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_480,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3b0 + ((ulong)local_488 & 0xffffffff) * 0x18),(value_type *)auStack_480);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)(pUVar41->super_TestCase).m_context,
             (Context *)local_230._0_8_,(char *)pCVar32);
  local_3f8 = (size_type *)CONCAT44(local_3f8._4_4_,1);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3b0 + ((ulong)local_3f8 & 0xffffffff) * 0x18),&local_3f0);
  local_f0 = (_Base_ptr)local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"out_te_firstFailedInputIndex","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_e0 + 0x10),local_f0,
             (undefined1 *)((long)&local_e8->_M_color + (long)local_f0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_300,(value_type *)(local_e0 + 0x10));
  local_308 = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_3b0);
  pSVar21 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar21->strongRefCount = 0;
  pSVar21->weakRefCount = 0;
  pSVar21->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02173258;
  pSVar21[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar21->strongRefCount = 1;
  pSVar21->weakRefCount = 1;
  pSVar10 = (local_458->m_program).m_state;
  if (pSVar10 != pSVar21) {
    if (pSVar10 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar2 = &pSVar10->strongRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        (local_458->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((local_458->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar2 = &((local_458->m_program).m_state)->weakRefCount;
      *pdVar2 = *pdVar2 + -1;
      UNLOCK();
      if (*pdVar2 == 0) {
        pSVar10 = (local_458->m_program).m_state;
        if (pSVar10 != (SharedPtrStateBase *)0x0) {
          (*pSVar10->_vptr_SharedPtrStateBase[1])();
        }
        (local_458->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (local_458->m_program).m_ptr = this_00;
    (local_458->m_program).m_state = pSVar21;
    LOCK();
    pSVar21->strongRefCount = pSVar21->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar2 = &((local_458->m_program).m_state)->weakRefCount;
    *pdVar2 = *pdVar2 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar2 = &pSVar21->strongRefCount;
  *pdVar2 = *pdVar2 + -1;
  UNLOCK();
  if (*pdVar2 == 0) {
    (*pSVar21->_vptr_SharedPtrStateBase[2])(pSVar21);
  }
  LOCK();
  pdVar2 = &pSVar21->weakRefCount;
  *pdVar2 = *pdVar2 + -1;
  UNLOCK();
  if (*pdVar2 == 0) {
    (*pSVar21->_vptr_SharedPtrStateBase[1])(pSVar21);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != (_Base_ptr)local_e0) {
    operator_delete(local_f0,local_e0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  pUVar41 = local_458;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_480._0_8_ != &aStack_470) {
    operator_delete((void *)auStack_480._0_8_,aStack_470._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_4b8._8_8_ != (pointer)(local_4a8 + 8)) {
    operator_delete((void *)local_4b8._8_8_,local_4a8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._8_8_ != &aStack_438) {
    operator_delete((void *)local_450._8_8_,aStack_438._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_300);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_320);
  lVar36 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3b0 + lVar36));
    lVar36 = lVar36 + -0x18;
  } while (lVar36 != -0x18);
  glu::operator<<(((pUVar41->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (pUVar41->m_program).m_ptr);
  if ((((pUVar41->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if ((Context *)local_230._0_8_ != (Context *)(local_230 + 0x10)) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if ((Context *)local_3d0._0_8_ != (Context *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,(ulong)(local_3d0._16_8_ + 1));
    }
    if (local_210 != (Context *)(local_208 + 8)) {
      operator_delete(local_210,(ulong)(local_208._8_8_ + 1));
    }
    if (local_1f0[0] != (ContextInfo *)local_1e0) {
      operator_delete(local_1f0[0],local_1e0._0_8_ + 1);
    }
    if ((bool *)local_1b0._M_allocated_capacity != &local_1a0) {
      operator_delete((void *)local_1b0._M_allocated_capacity,CONCAT71(uStack_19f,local_1a0) + 1);
    }
    if (local_110 != (_Base_ptr)local_100) {
      operator_delete(local_110,CONCAT71(local_100._1_7_,local_100[0]) + 1);
    }
    if ((pointer)local_1e0._16_8_ != (pointer)(local_1e0 + 0x20)) {
      operator_delete((void *)local_1e0._16_8_,CONCAT71(uStack_1bf,local_1e0[0x20]) + 1);
    }
    if (local_160._M_left != (_Base_ptr)local_140) {
      operator_delete(local_160._M_left,CONCAT71(local_140._1_7_,local_140[0]) + 1);
    }
    if (local_190 != (_Base_ptr)&local_180) {
      operator_delete(local_190,(ulong)((long)&local_180->_M_color + 1));
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160._0_8_ + 1);
    }
    paVar22 = &local_130.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar22) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      paVar22 = extraout_RAX;
    }
    return (int)paVar22;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x183e);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UserDefinedIOCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool			isPerPatchIO				= m_ioType == IO_TYPE_PER_PATCH				||
													  m_ioType == IO_TYPE_PER_PATCH_ARRAY		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	const bool			isExplicitVertexArraySize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN ||
													  m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY;

	const string		vertexAttrArrayInputSize	= m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT					? ""
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	? "gl_MaxPatchVertices"
													: m_vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY			? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
													: DE_NULL;

	const char* const	maybePatch					= isPerPatchIO ? "patch " : "";
	const string		outMaybePatch				= string() + maybePatch + "out ";
	const string		inMaybePatch				= string() + maybePatch + "in ";
	const bool			useBlock					= m_ioType == IO_TYPE_PER_VERTEX_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	string				tcsDeclarations;
	string				tcsStatements;

	string				tesDeclarations;
	string				tesStatements;

	{
		m_structTypes.push_back(glu::StructType("S"));

		const glu::VarType	highpFloat		(glu::TYPE_FLOAT, glu::PRECISION_HIGHP);
		glu::StructType&	structType		= m_structTypes.back();
		const glu::VarType	structVarType	(&structType);
		bool				usedStruct		= false;

		structType.addMember("x", glu::VarType(glu::TYPE_INT, glu::PRECISION_HIGHP));
		structType.addMember("y", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		if (useBlock)
		{
			// It is illegal to have a structure containing an array as an output variable
			structType.addMember("z", glu::VarType(highpFloat, 2));
		}

		if (useBlock)
		{
			const bool				useLightweightBlock = (m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY); // use leaner block to make sure it is not larger than allowed (per-patch storage is very limited)
			vector<IOBlock::Member>	blockMembers;

			if (!useLightweightBlock)
				blockMembers.push_back(IOBlock::Member("blockS",	structVarType));

			blockMembers.push_back(IOBlock::Member("blockFa",	glu::VarType(highpFloat, 3)));
			blockMembers.push_back(IOBlock::Member("blockSa",	glu::VarType(structVarType, 2)));
			blockMembers.push_back(IOBlock::Member("blockF",	highpFloat));

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "tcBlock", blockMembers)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "teBlock", blockMembers)));

			usedStruct = true;
		}
		else
		{
			const Variable var0("in_te_s", structVarType,	m_ioType != IO_TYPE_PER_PATCH);
			const Variable var1("in_te_f", highpFloat,		m_ioType != IO_TYPE_PER_PATCH);

			if (m_ioType != IO_TYPE_PER_PATCH_ARRAY)
			{
				// Arrays of structures are disallowed, add struct cases only if not arrayed variable
				m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));
				m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var0)));

				usedStruct = true;
			}

			m_tcsOutputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
			m_tesInputs.push_back	(SharedPtr<TopLevelObject>(new Variable(var1)));
		}

		tcsDeclarations += "in " + Variable("in_tc_attr", highpFloat, true).declareArray(vertexAttrArrayInputSize);

		if (usedStruct)
			tcsDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tcsStatements += "\t{\n"
						 "\t\thighp float v = 1.3;\n";

		for (int tcsOutputNdx = 0; tcsOutputNdx < (int)m_tcsOutputs.size(); tcsOutputNdx++)
		{
			const TopLevelObject&	output		= *m_tcsOutputs[tcsOutputNdx];
			const int				numElements	= !isPerPatchIO								? -1	//!< \note -1 means indexing with gl_InstanceID
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
			{
				tcsDeclarations += outMaybePatch + output.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY											? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	   : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY									? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT			? de::toString(int(NUM_OUTPUT_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_QUERY				? de::toString(m_context.getContextInfo().getInt(GL_MAX_PATCH_VERTICES))
																	   : m_tessControlOutArraySize == TESS_CONTROL_OUT_ARRAY_SIZE_SHADER_BUILTIN	? "gl_MaxPatchVertices"
																	   : "");
			}
			else
				tcsDeclarations += outMaybePatch + output.declare();

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(gl_InvocationID)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";

			tcsStatements += "\n\t\t// Assign values to output " + output.name() + "\n";
			if (isArray)
				tcsStatements += output.glslTraverseBasicTypeArray(numElements, 2, glslAssignBasicTypeObject);
			else
				tcsStatements += output.glslTraverseBasicType(2, glslAssignBasicTypeObject);

			if (!isPerPatchIO)
				tcsStatements += "\t\tv += float(" + de::toString(int(NUM_OUTPUT_VERTICES)) + "-gl_InvocationID-1)*" + de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) + ";\n";
		}
		tcsStatements += "\t}\n";

		if (usedStruct)
			tesDeclarations += de::toString(glu::declare(structType)) + ";\n";

		tesStatements += "\tbool allOk = true;\n"
						 "\thighp uint firstFailedInputIndex = 0u;\n"
						 "\t{\n"
						 "\t\thighp float v = 1.3;\n";
		for (int tesInputNdx = 0; tesInputNdx < (int)m_tesInputs.size(); tesInputNdx++)
		{
			const TopLevelObject&	input		= *m_tesInputs[tesInputNdx];
			const int				numElements	= !isPerPatchIO								? (int)NUM_OUTPUT_VERTICES
												: m_ioType == IO_TYPE_PER_PATCH				? 1
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: -2;
			const bool				isArray		= (numElements != 1);

			DE_ASSERT(numElements != -2);

			if (isArray)
				tesDeclarations += inMaybePatch + input.declareArray(m_ioType == IO_TYPE_PER_PATCH_ARRAY			? de::toString(int(NUM_PER_PATCH_ARRAY_ELEMS))
																	 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(int(NUM_PER_PATCH_BLOCKS))
																	 : isExplicitVertexArraySize					? de::toString(vertexAttrArrayInputSize)
																	 : "");
			else
				tesDeclarations += inMaybePatch + input.declare();

			tesStatements += "\n\t\t// Check values in input " + input.name() + "\n";
			if (isArray)
				tesStatements += input.glslTraverseBasicTypeArray(numElements, 2, glslCheckBasicTypeObject);
			else
				tesStatements += input.glslTraverseBasicType(2, glslCheckBasicTypeObject);
		}
		tesStatements += "\t}\n";
	}

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = " + de::toString(int(NUM_OUTPUT_VERTICES)) + ") out;\n"
												 "\n"
												 + tcsDeclarations +
												 "\n"
												 "patch out highp vec2 in_te_positionScale;\n"
												 "patch out highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tcsStatements +
												 "\n"
												 "	in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
												 "	in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
												 "\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType) +
												 "\n"
												 + tesDeclarations +
												 "\n"
												 "patch in highp vec2 in_te_positionScale;\n"
												 "patch in highp vec2 in_te_positionOffset;\n"
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "// Will contain the index of the first incorrect input,\n"
												 "// or the number of inputs if all are correct\n"
												 "flat out highp uint out_te_firstFailedInputIndex;\n"
												 "\n"
												 "bool compare_int   (int   a, int   b) { return a == b; }\n"
												 "bool compare_float (float a, float b) { return abs(a - b) < 0.01f; }\n"
												 "bool compare_vec4  (vec4  a, vec4  b) { return all(lessThan(abs(a - b), vec4(0.01f))); }\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + tesStatements +
												 "\n"
												 "	gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n"
												 "	in_f_color = allOk ? vec4(0.0, 1.0, 0.0, 1.0)\n"
												 "	                   : vec4(1.0, 0.0, 0.0, 1.0);\n"
												 "	out_te_firstFailedInputIndex = firstFailedInputIndex;\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_firstFailedInputIndex")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}